

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O2

bool load_from_gguf(char *fname,ggml_context *ctx_ggml,gguf_context *ctx_gguf)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  size_t pos;
  ulong uVar12;
  ulong uVar13;
  size_t __n;
  
  __stream = (FILE *)ggml_fopen(fname,"rb");
  uVar4 = 0;
  if (__stream != (FILE *)0x0) {
    __ptr = malloc(0x400000);
    uVar1 = gguf_get_n_tensors(ctx_gguf);
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    uVar11 = 0;
    while( true ) {
      uVar4 = (ulong)(uVar11 == uVar3);
      if (uVar11 == uVar3) break;
      uVar5 = gguf_get_tensor_name(ctx_gguf,uVar11);
      lVar6 = ggml_get_tensor(ctx_ggml,uVar5);
      if (lVar6 != 0) {
        lVar7 = gguf_get_data_offset(ctx_gguf);
        lVar8 = gguf_get_tensor_offset(ctx_gguf,uVar11);
        iVar2 = fseek(__stream,lVar7 + lVar8,0);
        if (iVar2 != 0) break;
        uVar9 = ggml_nbytes(lVar6);
        uVar13 = uVar9;
        for (uVar12 = 0; uVar12 < uVar9; uVar12 = uVar12 + 0x400000) {
          __n = 0x400000;
          if (uVar13 < 0x400000) {
            __n = uVar13;
          }
          sVar10 = fread(__ptr,1,__n,__stream);
          if (sVar10 != __n) goto LAB_00105331;
          ggml_backend_tensor_set(lVar6,__ptr,uVar12,__n);
          uVar13 = uVar13 - 0x400000;
        }
      }
      uVar11 = uVar11 + 1;
    }
LAB_00105331:
    fclose(__stream);
    free(__ptr);
  }
  return SUB81(uVar4,0);
}

Assistant:

bool load_from_gguf(const char * fname, struct ggml_context * ctx_ggml, struct gguf_context * ctx_gguf) {
    FILE * f = ggml_fopen(fname, "rb");
    if (!f) {
        return false;
    }

    const size_t buf_size = 4*1024*1024;
    void * buf = malloc(buf_size);

    const int n_tensors = gguf_get_n_tensors(ctx_gguf);
    for (int i = 0; i < n_tensors; i++) {
        const char * name = gguf_get_tensor_name(ctx_gguf, i);

        struct ggml_tensor * tensor = ggml_get_tensor(ctx_ggml, name);
        if (!tensor) {
            continue;
        }

        const size_t offs = gguf_get_data_offset(ctx_gguf) + gguf_get_tensor_offset(ctx_gguf, i);

        if (fseek(f, offs, SEEK_SET) != 0) {
            fclose(f);
            free(buf);
            return false;
        }

        const size_t nbytes = ggml_nbytes(tensor);
        for (size_t pos = 0; pos < nbytes; pos += buf_size) {
            const size_t nbytes_cpy = buf_size < nbytes - pos ? buf_size : nbytes - pos;

            if (fread(buf, 1, nbytes_cpy, f) != nbytes_cpy) {
                fclose(f);
                free(buf);
                return false;
            }

            ggml_backend_tensor_set(tensor, buf, pos, nbytes_cpy);
        }
    }

    fclose(f);
    free(buf);
    return true;
}